

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcLut.c
# Opt level: O2

int Abc_NtkSuperChoiceLut(Abc_Ntk_t *pNtk,int nLutSize,int nCutSizeMax,int fVerbose)

{
  char cVar1;
  int nVars;
  int iVar;
  Abc_Ntk_t *pNtk_00;
  uint *pIn1;
  long lVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  Abc_Obj_t *pAVar7;
  Abc_ManScl_t *pManScl;
  uint **ppuVar8;
  uint **ppuVar9;
  Cut_Man_t *p;
  Vec_Int_t *vFanCounts;
  Abc_ManCut_t *p_00;
  Vec_Ptr_t *pVVar10;
  ProgressBar *p_01;
  uint *puVar11;
  Abc_Obj_t *pAVar12;
  undefined8 *puVar13;
  ulong uVar14;
  Abc_Obj_t *pAVar15;
  char *pcVar16;
  int *piVar17;
  void *pvVar18;
  long *plVar19;
  byte bVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  int iVar25;
  uint uVar26;
  int *pBSet;
  ulong uVar27;
  ulong uVar28;
  int i;
  ulong uVar29;
  ulong uVar30;
  ulong uVar31;
  ulong uVar32;
  int iVar33;
  bool bVar34;
  ulong local_150;
  uint **local_140;
  Vec_Ptr_t *local_138;
  uint local_114;
  uint *local_110;
  uint local_f4;
  uint local_f0;
  uint local_ec;
  undefined8 auStack_68 [7];
  
  if ((pNtk->ntkFunc != ABC_FUNC_SOP) || (pNtk->ntkType != ABC_NTK_LOGIC)) {
    __assert_fail("Abc_NtkIsSopLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x5b,"int Abc_NtkSuperChoiceLut(Abc_Ntk_t *, int, int, int)");
  }
  local_150 = (ulong)(uint)nLutSize;
  if (nLutSize - 7U < 0xfffffffc) {
    printf("LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n",local_150,6);
  }
  else {
    if (nCutSizeMax < 0x10 && nLutSize < nCutSizeMax) {
      for (iVar25 = 0; iVar25 < pNtk->vCis->nSize; iVar25 = iVar25 + 1) {
        pAVar7 = Abc_NtkCi(pNtk,iVar25);
        *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
      }
      pManScl = (Abc_ManScl_t *)calloc(1,0x80);
      pManScl->nLutSize = nLutSize;
      pManScl->nCutSizeMax = nCutSizeMax;
      pManScl->nNodesMax = 1000;
      bVar20 = (char)nCutSizeMax - 5;
      uVar31 = 0;
      iVar25 = 1 << (bVar20 & 0x1f);
      if (nCutSizeMax < 6) {
        iVar25 = 1;
      }
      pManScl->nWords = iVar25;
      if (nCutSizeMax < 6) {
        bVar20 = 0;
      }
      ppuVar8 = (uint **)Extra_ArrayAlloc(nCutSizeMax,iVar25,4);
      pManScl->uVars = ppuVar8;
      ppuVar9 = (uint **)Extra_ArrayAlloc(1000,iVar25,4);
      pManScl->uSims = ppuVar9;
      local_140 = (uint **)Extra_ArrayAlloc(2 << ((byte)nLutSize & 0x1f),iVar25,4);
      pManScl->uCofs = local_140;
      memset(*ppuVar8,0,(long)((nCutSizeMax << (bVar20 & 0x1f)) << 2));
      uVar32 = (ulong)(uint)(iVar25 << 5);
      if (iVar25 << 5 < 1) {
        uVar32 = uVar31;
      }
      uVar22 = 0;
      if (0 < nCutSizeMax) {
        uVar22 = (ulong)(uint)nCutSizeMax;
      }
      for (; uVar31 != uVar22; uVar31 = uVar31 + 1) {
        for (uVar21 = 0; (uint)uVar32 != uVar21; uVar21 = uVar21 + 1) {
          if ((uVar21 & 1 << ((byte)uVar31 & 0x1f)) != 0) {
            ppuVar8[uVar31][uVar21 >> 5] = ppuVar8[uVar31][uVar21 >> 5] | 1 << ((byte)uVar21 & 0x1f)
            ;
          }
        }
      }
      Abc_NtkStartCutManForScl_Params._32_8_ = 0;
      Abc_NtkStartCutManForScl_Params._56_8_ = 0;
      Abc_NtkStartCutManForScl_Params._64_8_ = 0;
      Abc_NtkStartCutManForScl_Params._40_8_ = 0;
      Abc_NtkStartCutManForScl_Params._48_8_ = 0;
      Abc_NtkStartCutManForScl_Params._72_8_ = 0;
      Abc_NtkStartCutManForScl_Params._16_8_ = 0;
      Abc_NtkStartCutManForScl_Params._4_4_ = 500;
      Abc_NtkStartCutManForScl_Params._24_8_ = 1;
      Abc_NtkStartCutManForScl_Params._12_4_ = 0;
      Abc_NtkStartCutManForScl_Params._8_4_ = pNtk->vObjs->nSize;
      Abc_NtkStartCutManForScl_Params._0_4_ = nLutSize;
      p = Cut_ManStart((Cut_Params_t *)Abc_NtkStartCutManForScl_Params);
      if (Abc_NtkStartCutManForScl_Params._32_4_ != 0) {
        vFanCounts = Abc_NtkFanoutCounts(pNtk);
        Cut_ManSetFanoutCounts(p,vFanCounts);
      }
      for (iVar25 = 0; iVar25 < pNtk->vCis->nSize; iVar25 = iVar25 + 1) {
        pAVar7 = Abc_NtkCi(pNtk,iVar25);
        if (0 < (pAVar7->vFanouts).nSize) {
          Cut_NodeSetTriv(p,pAVar7->Id);
        }
      }
      p_00 = Abc_NtkManCutStart(nCutSizeMax,100000,100000,100000);
      s_pLeaves = Abc_NtkManCutReadCutSmall(p_00);
      pVVar10 = Abc_NtkManCutReadVisited(p_00);
      pManScl->vVolume = pVVar10;
      iVar25 = pNtk->vObjs->nSize;
      p_01 = Extra_ProgressBarStart(_stdout,iVar25);
      pBSet = pManScl->pBSet;
      i = 0;
      local_ec = 0;
      local_114 = 0;
      local_f0 = 0;
      local_f4 = 0;
LAB_002473a3:
      if (pNtk->vObjs->nSize <= i) {
LAB_00247dda:
        Extra_ProgressBarStop(p_01);
        if (pManScl->uVars != (uint **)0x0) {
          free(pManScl->uVars);
          pManScl->uVars = (uint **)0x0;
        }
        if (pManScl->uSims != (uint **)0x0) {
          free(pManScl->uSims);
          pManScl->uSims = (uint **)0x0;
        }
        free(local_140);
        free(pManScl);
        Abc_NtkManCutStop(p_00);
        Cut_ManStop(p);
        uVar21 = 0;
        for (iVar25 = 0; iVar25 < pNtk->vCos->nSize; iVar25 = iVar25 + 1) {
          plVar19 = (long *)Vec_PtrEntry(pNtk->vCos,iVar25);
          plVar19 = *(long **)(*(long *)(*(long *)(*plVar19 + 0x20) + 8) +
                              (long)*(int *)plVar19[4] * 8);
          if (*(int *)((long)plVar19 + 0x1c) == 1) {
            plVar19 = *(long **)(*(long *)(*(long *)(*plVar19 + 0x20) + 8) +
                                (long)*(int *)plVar19[4] * 8);
          }
          uVar4 = *(uint *)((long)plVar19 + 0x14) >> 0xc;
          if (uVar21 <= uVar4) {
            uVar21 = uVar4;
          }
        }
        if (fVerbose != 0) {
          printf("Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n",
                 (ulong)local_ec,(ulong)local_114,(ulong)local_f0,(ulong)local_f4,(ulong)uVar21,
                 nLutSize);
        }
        for (iVar25 = 0; iVar25 < pNtk->vObjs->nSize; iVar25 = iVar25 + 1) {
          pAVar7 = Abc_NtkObj(pNtk,iVar25);
          if (pAVar7 != (Abc_Obj_t *)0x0) {
            pAVar7->pNext = (Abc_Obj_t *)0x0;
          }
        }
        iVar25 = Abc_NtkCheck(pNtk);
        if (iVar25 != 0) {
          return 1;
        }
        puts("Abc_NtkSuperChoiceLut: The network check has failed.");
        return 0;
      }
      pAVar7 = Abc_NtkObj(pNtk,i);
      if (pAVar7 != (Abc_Obj_t *)0x0) {
        if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= i)) {
          Extra_ProgressBarUpdate_int(p_01,i,(char *)0x0);
        }
        if (i < iVar25) {
          if ((pAVar7->vFanins).nSize == 2) {
            puVar11 = (uint *)Abc_NodeGetCutsRecursive(p,pAVar7,0,0);
            if (puVar11 == (uint *)0x0) {
              __assert_fail("pCut != NULL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xd8,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            if (0xfff < *(uint *)&pAVar7->field_0x14) {
              __assert_fail("pObj->Level == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xd9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            local_ec = local_ec + 1;
            uVar21 = *(uint *)&pAVar7->field_0x14 | 0xf4240000;
LAB_00247440:
            *(uint *)&pAVar7->field_0x14 = uVar21;
LAB_00247443:
            puVar11 = *(uint **)(puVar11 + 4);
            if (puVar11 != (uint *)0x0) goto code_r0x0024744c;
            if (0xf423ffff < uVar21) {
              __assert_fail("pObj->Level < LARGE_LEVEL",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0xe9,"void Abc_NodeLutMap(Cut_Man_t *, Abc_Obj_t *)");
            }
            *(uint *)&pAVar7->field_0x14 = uVar21 + 0x1000;
            local_138 = Abc_NodeFindCut(p_00,pAVar7,0);
            pManScl->vLeaves = local_138;
            if ((local_138->nSize <= nLutSize) ||
               (pVVar10 = pManScl->vVolume, 1000 < pVVar10->nSize)) goto LAB_00247dd3;
            Abc_NodeSuperChoiceCollect2(pAVar7,local_138,pVVar10);
            if ((long)pVVar10->nSize < 1) {
              __assert_fail("p->nSize > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                            ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
            }
            if ((Abc_Obj_t *)pVVar10->pArray[(long)pVVar10->nSize + -1] != pAVar7) {
              __assert_fail("Vec_PtrEntryLast(p->vVolume) == pObj",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0x21b,"Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)")
              ;
            }
            local_110 = Abc_NodeSuperChoiceTruth(pManScl);
            pManScl->uTruth = local_110;
            uVar21 = local_138->nSize;
            uVar4 = Extra_TruthSupport(local_110,uVar21);
            uVar23 = (uVar4 >> 1 & 0x55555555) + (uVar4 & 0x55555555);
            uVar23 = (uVar23 >> 2 & 0x33333333) + (uVar23 & 0x33333333);
            uVar23 = (uVar23 >> 4 & 0x7070707) + (uVar23 & 0x7070707);
            uVar23 = (uVar23 >> 8 & 0xf000f) + (uVar23 & 0xf000f);
            uVar23 = (uVar23 >> 0x10) + (uVar23 & 0xffff);
            if ((int)uVar21 < (int)uVar23) {
              __assert_fail("nSuppVars <= nVars",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                            ,0x222,"Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)")
              ;
            }
            local_114 = local_114 + 1;
            if (uVar23 == 0) {
              *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff;
              goto LAB_00247dd3;
            }
            if (uVar23 == 1) {
              uVar23 = 0;
              while( true ) {
                if (uVar21 == uVar23) {
                  __assert_fail("i < nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                                ,0x22e,
                                "Abc_Obj_t *Abc_NodeSuperChoiceLut(Abc_ManScl_t *, Abc_Obj_t *)");
                }
                if ((uVar4 >> (uVar23 & 0x1f) & 1) != 0) break;
                uVar23 = uVar23 + 1;
              }
              pvVar18 = Vec_PtrEntry(local_138,uVar23);
              *(uint *)&pAVar7->field_0x14 =
                   *(uint *)&pAVar7->field_0x14 & 0xfff |
                   *(uint *)((long)pvVar18 + 0x14) & 0xfffff000;
              goto LAB_00247dd3;
            }
            if (uVar23 != uVar21) {
              Extra_TruthShrink(*local_140,local_110,uVar23,uVar21,uVar4);
              Extra_TruthCopy(local_110,*local_140,uVar21);
              Abc_NodeLeavesRemove(local_138,~(-1 << ((byte)uVar21 & 0x1f) | uVar4),uVar21);
            }
            goto LAB_00247616;
          }
          goto LAB_00247dd3;
        }
        goto LAB_00247dda;
      }
      goto LAB_00247dd3;
    }
    printf("Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n",
           (ulong)(uint)nCutSizeMax,local_150,0xf);
  }
  return 0;
code_r0x0024744c:
  uVar4 = 0;
  for (uVar31 = 0; uVar31 < *puVar11 >> 0x1c; uVar31 = uVar31 + 1) {
    pAVar12 = Abc_NtkObj(pAVar7->pNtk,puVar11[uVar31 + 6]);
    uVar21 = *(uint *)&pAVar12->field_0x14 >> 0xc;
    if (uVar4 <= uVar21) {
      uVar4 = uVar21;
    }
  }
  uVar21 = *(uint *)&pAVar7->field_0x14;
  if (uVar4 < uVar21 >> 0xc) goto code_r0x00247489;
  goto LAB_00247443;
code_r0x00247489:
  uVar21 = uVar21 & 0xfff | uVar4 << 0xc;
  goto LAB_00247440;
LAB_00247616:
  iVar5 = (int)local_150;
  if (iVar5 < local_138->nSize) goto code_r0x0024762a;
  pAVar12 = Abc_NtkCreateNode(pAVar7->pNtk);
  for (iVar5 = 0; iVar5 < local_138->nSize; iVar5 = iVar5 + 1) {
    pAVar15 = (Abc_Obj_t *)Vec_PtrEntry(local_138,iVar5);
    Abc_ObjAddFanin(pAVar12,pAVar15);
  }
  pcVar16 = Abc_SopCreateFromTruth((Mem_Flex_t *)pAVar7->pNtk->pManFunc,local_138->nSize,local_110);
  (pAVar12->field_5).pData = pcVar16;
  uVar21 = Abc_NodeGetLevel(pAVar12);
  *(uint *)&pAVar12->field_0x14 = *(uint *)&pAVar12->field_0x14 & 0xfff | uVar21 << 0xc;
  local_f0 = local_f0 + 1;
  if ((uVar21 & 0xfffff) < *(uint *)&pAVar7->field_0x14 >> 0xc) {
    *(uint *)&pAVar7->field_0x14 = *(uint *)&pAVar7->field_0x14 & 0xfff | uVar21 << 0xc;
    local_f4 = local_f4 + 1;
  }
  else {
    Abc_NtkDeleteObj_rec(pAVar12,1);
  }
  goto LAB_00247dd3;
code_r0x0024762a:
  puVar13 = (undefined8 *)Vec_PtrEntry(local_138,0);
  nVars = local_138->nSize;
  if (nVars <= iVar5) {
    __assert_fail("nVars > p->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x2a5,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  pNtk_00 = (Abc_Ntk_t *)*puVar13;
  Abc_NodeDecomposeSort((Abc_Obj_t **)local_138->pArray,nVars,pBSet,iVar5);
  local_138 = pManScl->vLeaves;
  pvVar18 = Vec_PtrEntry(local_138,pManScl->pBSet[0]);
  uVar21 = *(uint *)((long)pvVar18 + 0x14);
  pvVar18 = Vec_PtrEntry(local_138,pManScl->pBSet[1]);
  if (*(uint *)((long)pvVar18 + 0x14) >> 0xc < uVar21 >> 0xc) {
    __assert_fail("((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[0]))->Level <= ((Abc_Obj_t *)Vec_PtrEntry(p->vLeaves, p->pBSet[1]))->Level"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x2ae,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  local_110 = pManScl->uTruth;
  local_140 = pManScl->uCofs;
  Extra_TruthCopy(local_140[1],local_110,nVars);
  uVar21 = pManScl->nLutSize;
  local_150 = (ulong)uVar21;
  uVar31 = 0;
  if (0 < (int)uVar21) {
    uVar31 = (ulong)uVar21;
  }
  iVar5 = 2;
  for (uVar32 = 0; uVar32 != uVar31; uVar32 = uVar32 + 1) {
    bVar20 = (byte)uVar32 & 0x1f;
    iVar33 = 1 << bVar20;
    if (1 << bVar20 < 1) {
      iVar33 = 0;
    }
    ppuVar8 = local_140 + (long)iVar5 + 1;
    while (bVar34 = iVar33 != 0, iVar33 = iVar33 + -1, bVar34) {
      Extra_TruthCopy(ppuVar8[-1],local_140[iVar5 / 2],nVars);
      Extra_TruthCopy(*ppuVar8,local_140[iVar5 / 2],nVars);
      iVar = pBSet[uVar32];
      Extra_TruthCofactor0(ppuVar8[-1],nVars,iVar);
      Extra_TruthCofactor1(*ppuVar8,nVars,iVar);
      iVar5 = iVar5 + 2;
      ppuVar8 = ppuVar8 + 2;
    }
  }
  bVar20 = (byte)uVar21;
  if (iVar5 != 2 << (bVar20 & 0x1f)) {
    __assert_fail("c == (2 << p->nLutSize)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,699,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  uVar4 = 1 << (bVar20 & 0x1f);
  uVar32 = (ulong)(uint)(1 << ((byte)nVars - 5 & 0x1f));
  if (nVars < 6) {
    uVar32 = 1;
  }
  uVar30 = 0;
  uVar22 = 0;
  if (0 < (int)uVar4) {
    uVar22 = (ulong)uVar4;
  }
  uVar23 = 0;
  for (; uVar30 != uVar22; uVar30 = uVar30 + 1) {
    uVar29 = 0;
    if (0 < (int)uVar23) {
      uVar29 = (ulong)uVar23;
    }
    for (uVar24 = 0; uVar24 != uVar29; uVar24 = uVar24 + 1) {
      uVar28 = uVar32;
      do {
        if ((int)uVar28 < 1) {
          cVar1 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar24];
          (&Abc_NodeDecomposeStep_nCofClasses)[uVar24] = cVar1 + '\x01';
          (&Abc_NodeDecomposeStep_pCofClasses)[(long)cVar1 + uVar24 * 0x40] = (char)uVar30;
          uVar29 = uVar24 & 0xffffffff;
          goto LAB_0024788b;
        }
        lVar2 = uVar28 - 1;
        lVar3 = uVar28 - 1;
        uVar28 = uVar28 - 1;
      } while (local_140[(long)(int)uVar4 + uVar30][lVar2] ==
               local_140[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)[uVar24 * 0x40] +
                         (long)(int)uVar4][lVar3]);
    }
LAB_0024788b:
    if ((uint)uVar29 == uVar23) {
      (&Abc_NodeDecomposeStep_nCofClasses)[(int)uVar23] = 1;
      (&Abc_NodeDecomposeStep_pCofClasses)[(long)(int)uVar23 * 0x40] = (char)uVar30;
      if ((int)uVar4 / 2 <= (int)uVar23) goto LAB_00247c8f;
      uVar23 = uVar23 + 1;
    }
  }
  uVar26 = uVar23;
  if (1 < uVar23) {
    uVar26 = 0;
    for (uVar6 = uVar23 - 1; uVar6 != 0; uVar6 = uVar6 >> 1) {
      uVar26 = uVar26 + 1;
    }
  }
  if ((int)uVar21 <= (int)uVar26) {
    __assert_fail("nVarsNew < p->nLutSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x2d6,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
  Extra_TruthClear(local_110,nVars);
  if ((int)uVar23 < 1) {
    uVar23 = 0;
  }
  uVar32 = (ulong)uVar26;
  for (uVar29 = 0; uVar29 != uVar23; uVar29 = uVar29 + 1) {
    puVar11 = local_140[(long)(char)(&Abc_NodeDecomposeStep_pCofClasses)[uVar29 * 0x40] +
                        (long)(int)uVar4];
    for (uVar24 = 0; uVar32 != uVar24; uVar24 = uVar24 + 1) {
      if (((uint)uVar29 >> ((uint)uVar24 & 0x1f) & 1) == 0) {
        Extra_TruthSharp(puVar11,puVar11,pManScl->uVars[pManScl->pBSet[uVar24]],nVars);
      }
      else {
        Extra_TruthAnd(puVar11,puVar11,pManScl->uVars[pManScl->pBSet[uVar24]],nVars);
      }
    }
    Extra_TruthOr(local_110,local_110,puVar11,nVars);
  }
  puVar11 = *local_140;
  uVar29 = (ulong)(uint)(1 << (bVar20 - 5 & 0x1f));
  if ((int)uVar21 < 6) {
    uVar29 = 1;
  }
  for (uVar24 = 0; uVar24 != uVar32; uVar24 = uVar24 + 1) {
    Extra_TruthClear(puVar11,uVar21);
    for (uVar28 = 0; uVar28 != uVar23; uVar28 = uVar28 + 1) {
      if ((1 << ((byte)uVar24 & 0x1f) & (uint)uVar28) != 0) {
        bVar20 = (&Abc_NodeDecomposeStep_nCofClasses)[uVar28];
        if ((char)(&Abc_NodeDecomposeStep_nCofClasses)[uVar28] < '\x01') {
          bVar20 = 0;
        }
        for (uVar27 = 0; uVar27 != bVar20; uVar27 = uVar27 + 1) {
          pIn1 = local_140[1];
          for (uVar14 = uVar29; 0 < (int)uVar14; uVar14 = uVar14 - 1) {
            pIn1[uVar14 - 1] = 0xffffffff;
          }
          uVar4 = uVar21;
          for (uVar14 = 0; uVar4 = uVar4 - 1, uVar31 != uVar14; uVar14 = uVar14 + 1) {
            if (((uint)(int)(char)(&Abc_NodeDecomposeStep_pCofClasses)[uVar27 + uVar28 * 0x40] >>
                 (uVar4 & 0x1f) & 1) == 0) {
              Extra_TruthSharp(pIn1,pIn1,pManScl->uVars[uVar14],uVar21);
            }
            else {
              Extra_TruthAnd(pIn1,pIn1,pManScl->uVars[uVar14],uVar21);
            }
          }
          Extra_TruthOr(puVar11,puVar11,pIn1,uVar21);
        }
      }
    }
    pAVar12 = Abc_NtkCreateNode(pNtk_00);
    for (uVar28 = 0; uVar31 != uVar28; uVar28 = uVar28 + 1) {
      pAVar15 = (Abc_Obj_t *)Vec_PtrEntry(local_138,pBSet[uVar28]);
      Abc_ObjAddFanin(pAVar12,pAVar15);
    }
    pcVar16 = Abc_SopCreateFromTruth((Mem_Flex_t *)pNtk_00->pManFunc,uVar21,puVar11);
    (pAVar12->field_5).pData = pcVar16;
    iVar5 = Abc_NodeGetLevel(pAVar12);
    *(uint *)&pAVar12->field_0x14 = *(uint *)&pAVar12->field_0x14 & 0xfff | iVar5 << 0xc;
    auStack_68[uVar24] = pAVar12;
  }
  for (uVar31 = 0; uVar32 != uVar31; uVar31 = uVar31 + 1) {
    iVar5 = pBSet[uVar31];
    if (((long)iVar5 < 0) || (local_138->nSize <= iVar5)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                    ,0x1a6,"void Vec_PtrWriteEntry(Vec_Ptr_t *, int, void *)");
    }
    local_138->pArray[iVar5] = (void *)auStack_68[uVar31];
  }
  piVar17 = pBSet + uVar32;
  uVar23 = 0;
  for (uVar4 = uVar26; (int)uVar4 < (int)uVar21; uVar4 = uVar4 + 1) {
    uVar23 = uVar23 | 1 << ((byte)*piVar17 & 0x1f);
    piVar17 = piVar17 + 1;
  }
  Abc_NodeLeavesRemove(local_138,uVar23,nVars);
  iVar5 = (nVars - uVar21) + uVar26;
  Extra_TruthShrink(*local_140,local_110,iVar5,nVars,~(-1 << ((byte)nVars & 0x1f) | uVar23));
  Extra_TruthCopy(local_110,*local_140,nVars);
  iVar5 = Extra_TruthVarInSupport(local_110,nVars,iVar5);
  if (iVar5 != 0) {
    __assert_fail("!Extra_TruthVarInSupport( p->uTruth, nVars, nVars - p->nLutSize + nVarsNew )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcLut.c"
                  ,0x30e,"int Abc_NodeDecomposeStep(Abc_ManScl_t *)");
  }
LAB_00247c8f:
  if (uVar30 != uVar22) goto LAB_00247d81;
  goto LAB_00247616;
LAB_00247d81:
  for (iVar5 = 0; iVar5 < local_138->nSize; iVar5 = iVar5 + 1) {
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(local_138,iVar5);
    if (((*(uint *)&pAVar7->field_0x14 & 0xf) == 7) && ((pAVar7->vFanouts).nSize == 0)) {
      Abc_NtkDeleteObj_rec(pAVar7,1);
    }
  }
LAB_00247dd3:
  i = i + 1;
  goto LAB_002473a3;
}

Assistant:

int Abc_NtkSuperChoiceLut( Abc_Ntk_t * pNtk, int nLutSize, int nCutSizeMax, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_ManCut_t * pManCut;
    Abc_ManScl_t * pManScl;
    Cut_Man_t * pManCuts;
    Abc_Obj_t * pObj, * pFanin, * pObjTop;
    int i, LevelMax, nNodes;
    int nNodesTried, nNodesDec, nNodesExist, nNodesUsed;

    assert( Abc_NtkIsSopLogic(pNtk) );
    if ( nLutSize < 3 || nLutSize > SCL_LUT_MAX )
    {
        printf( "LUT size (%d) does not belong to the interval: 3 <= LUT size <= %d\n", nLutSize, SCL_LUT_MAX );
        return 0;
    }
    if ( nCutSizeMax <= nLutSize || nCutSizeMax > SCL_VARS_MAX )
    {
        printf( "Cut size (%d) does not belong to the interval: LUT size (%d) < Cut size <= %d\n", nCutSizeMax, nLutSize, SCL_VARS_MAX );
        return 0;
    }

    assert( nLutSize <= SCL_LUT_MAX );
    assert( nCutSizeMax <= SCL_VARS_MAX );
    nNodesTried = nNodesDec = nNodesExist = nNodesUsed = 0;

    // set the delays of the CIs
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->Level = 0;

//Abc_NtkLevel( pNtk );
 
    // start the managers
    pManScl = Abc_ManSclStart( nLutSize, nCutSizeMax, 1000 );
    pManCuts = Abc_NtkStartCutManForScl( pNtk, nLutSize );
    pManCut = Abc_NtkManCutStart( nCutSizeMax, 100000, 100000, 100000 );
    s_pLeaves = Abc_NtkManCutReadCutSmall( pManCut );
    pManScl->vVolume = Abc_NtkManCutReadVisited( pManCut );

    // process each internal node (assuming topological order of nodes!!!)
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachObj( pNtk, pObj, i )
    {
//        if ( i != nNodes-1 )
//            continue;
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        if ( i >= nNodes )
            break;
        if ( Abc_ObjFaninNum(pObj) != 2 )
            continue;
        nNodesTried++;

        // map this node using regular cuts
//        pObj->Level = 0;
        Abc_NodeLutMap( pManCuts, pObj );
        // compute the cut
        pManScl->vLeaves = Abc_NodeFindCut( pManCut, pObj, 0 );
        if ( Vec_PtrSize(pManScl->vLeaves) <= nLutSize )
            continue;
        // get the volume of the cut
        if ( Vec_PtrSize(pManScl->vVolume) > SCL_NODE_MAX )
            continue;
        nNodesDec++;

        // decompose the cut
        pObjTop = Abc_NodeSuperChoiceLut( pManScl, pObj );
        if ( pObjTop == NULL )
            continue;
        nNodesExist++;

        // if there is no delay improvement, skip; otherwise, update level
        if ( pObjTop->Level >= pObj->Level )
        {
            Abc_NtkDeleteObj_rec( pObjTop, 1 );
            continue;
        }
        pObj->Level = pObjTop->Level;
        nNodesUsed++;
    }
    Extra_ProgressBarStop( pProgress );

    // delete the managers
    Abc_ManSclStop( pManScl );
    Abc_NtkManCutStop( pManCut );
    Cut_ManStop( pManCuts );

    // get the largest arrival time
    LevelMax = 0;
    Abc_NtkForEachCo( pNtk, pObj, i )
    {
        pFanin = Abc_ObjFanin0( pObj );
        // skip inv/buf
        if ( Abc_ObjFaninNum(pFanin) == 1 )
            pFanin = Abc_ObjFanin0( pFanin );
        // get the new level
        LevelMax = Abc_MaxInt( LevelMax, (int)pFanin->Level );
    }

    if ( fVerbose )
    printf( "Try = %d. Dec = %d. Exist = %d. Use = %d. SUPER = %d levels of %d-LUTs.\n", 
        nNodesTried, nNodesDec, nNodesExist, nNodesUsed, LevelMax, nLutSize );
//    if ( fVerbose )
//    printf( "The network is superchoiced for %d levels of %d-LUTs.\n", LevelMax, nLutSize );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->pNext = NULL;

    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkSuperChoiceLut: The network check has failed.\n" );
        return 0;
    }
    return 1;
}